

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

AtanLayerParams * __thiscall
CoreML::Specification::AtanLayerParams::New(AtanLayerParams *this,Arena *arena)

{
  AtanLayerParams *this_00;
  
  this_00 = (AtanLayerParams *)operator_new(0x18);
  AtanLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::AtanLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

AtanLayerParams* AtanLayerParams::New(::google::protobuf::Arena* arena) const {
  AtanLayerParams* n = new AtanLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}